

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa.cpp
# Opt level: O1

bool __thiscall mocker::SSADestruction::operator()(SSADestruction *this)

{
  insertAllocas(this);
  splitCriticalEdges(this);
  replacePhisWithParallelCopies(this);
  sequentializeParallelCopies(this);
  return false;
}

Assistant:

bool SSADestruction::operator()() {
  insertAllocas();
  splitCriticalEdges();
  //  ir::printFunc(func, std::cerr);
  replacePhisWithParallelCopies();
  sequentializeParallelCopies();
  return false;
}